

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode Curl_pin_peer_pubkey(Curl_easy *data,char *pinnedpubkey,uchar *pubkey,size_t pubkeylen)

{
  size_t __s1;
  int iVar1;
  CURLcode CVar2;
  char *pcVar3;
  FILE *__stream;
  FILE *pFVar4;
  char *pcVar5;
  FILE *local_4e8;
  bool local_4d9;
  size_t want;
  char buffer [1024];
  FILE *fp;
  size_t left;
  uchar *pem_ptr;
  dynbuf buf;
  FILE *pFStack_80;
  CURLcode pem_read;
  size_t pem_len;
  size_t size;
  long filesize;
  uchar *sha256sumdigest;
  char *end_pos;
  char *begin_pos;
  char *pinkeycopy;
  char *encoded;
  size_t encodedlen;
  CURLcode encode;
  CURLcode result;
  size_t pubkeylen_local;
  uchar *pubkey_local;
  char *pinnedpubkey_local;
  Curl_easy *data_local;
  
  encodedlen._4_4_ = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
  if (pinnedpubkey == (char *)0x0) {
    data_local._4_4_ = CURLE_OK;
  }
  else if ((pubkey == (uchar *)0x0) || (pubkeylen == 0)) {
    data_local._4_4_ = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
  }
  else {
    _encode = (FILE *)pubkeylen;
    pubkeylen_local = (size_t)pubkey;
    pubkey_local = (uchar *)pinnedpubkey;
    pinnedpubkey_local = (char *)data;
    iVar1 = strncmp(pinnedpubkey,"sha256//",8);
    if (iVar1 == 0) {
      encoded = (char *)0x0;
      pinkeycopy = (char *)0x0;
      if (Curl_ssl->sha256sum == (_func_CURLcode_uchar_ptr_size_t_uchar_ptr_size_t *)0x0) {
        return encodedlen._4_4_;
      }
      filesize = (long)(*Curl_cmalloc)(0x20);
      if ((uchar *)filesize == (uchar *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      encodedlen._0_4_ =
           (*Curl_ssl->sha256sum)((uchar *)pubkeylen_local,(size_t)_encode,(uchar *)filesize,0x20);
      if ((CURLcode)encodedlen == CURLE_OK) {
        encodedlen._0_4_ = Curl_base64_encode((char *)filesize,0x20,&pinkeycopy,(size_t *)&encoded);
      }
      (*Curl_cfree)((void *)filesize);
      filesize = 0;
      if ((CURLcode)encodedlen != CURLE_OK) {
        return (CURLcode)encodedlen;
      }
      if (((pinnedpubkey_local != (char *)0x0) &&
          ((*(ulong *)(pinnedpubkey_local + 0xa2c) >> 0x1e & 1) != 0)) &&
         ((*(long *)(pinnedpubkey_local + 0x1310) == 0 ||
          (0 < *(int *)(*(long *)(pinnedpubkey_local + 0x1310) + 8))))) {
        Curl_infof((Curl_easy *)pinnedpubkey_local," public key hash: sha256//%s",pinkeycopy);
      }
      end_pos = (*Curl_cstrdup)((char *)pubkey_local);
      begin_pos = end_pos;
      if (end_pos == (char *)0x0) {
        (*Curl_cfree)(pinkeycopy);
        return CURLE_OUT_OF_MEMORY;
      }
      do {
        sha256sumdigest = (uchar *)strstr(end_pos,";sha256//");
        pcVar5 = encoded;
        if (sha256sumdigest != (uchar *)0x0) {
          *sha256sumdigest = '\0';
        }
        pcVar3 = (char *)strlen(end_pos + 8);
        if ((pcVar5 == pcVar3) &&
           (iVar1 = memcmp(pinkeycopy,end_pos + 8,(size_t)encoded), iVar1 == 0)) {
          encodedlen._4_4_ = CURLE_OK;
          break;
        }
        if (sha256sumdigest != (uchar *)0x0) {
          *sha256sumdigest = ';';
          end_pos = strstr((char *)sha256sumdigest,"sha256//");
        }
        local_4d9 = sha256sumdigest != (uchar *)0x0 && end_pos != (char *)0x0;
      } while (local_4d9);
      (*Curl_cfree)(pinkeycopy);
      pinkeycopy = (char *)0x0;
      (*Curl_cfree)(begin_pos);
    }
    else {
      left = 0;
      __stream = fopen64((char *)pubkey_local,"rb");
      if (__stream == (FILE *)0x0) {
        return encodedlen._4_4_;
      }
      Curl_dyn_init((dynbuf *)&pem_ptr,0x100000);
      iVar1 = fseek(__stream,0,2);
      if (iVar1 == 0) {
        size = ftell(__stream);
        iVar1 = fseek(__stream,0,0);
        if ((((iVar1 == 0) && (-1 < (long)size)) && ((long)size < 0x100001)) &&
           (fp = (FILE *)curlx_sotouz(size), pem_len = (size_t)fp, _encode <= fp)) {
          do {
            if (fp < (FILE *)0x401) {
              local_4e8 = fp;
            }
            else {
              local_4e8 = (FILE *)0x400;
            }
            pFVar4 = (FILE *)fread(&want,1,(size_t)local_4e8,__stream);
            if ((local_4e8 != pFVar4) ||
               (CVar2 = Curl_dyn_addn((dynbuf *)&pem_ptr,&want,(size_t)local_4e8),
               __s1 = pubkeylen_local, CVar2 != CURLE_OK)) goto LAB_001bb54a;
            fp = (FILE *)((long)fp - (long)local_4e8);
          } while (fp != (FILE *)0x0);
          if (_encode == (FILE *)pem_len) {
            pcVar5 = Curl_dyn_ptr((dynbuf *)&pem_ptr);
            iVar1 = memcmp((void *)__s1,pcVar5,(size_t)_encode);
            if (iVar1 == 0) {
              encodedlen._4_4_ = CURLE_OK;
            }
          }
          else {
            pcVar5 = Curl_dyn_ptr((dynbuf *)&pem_ptr);
            buf.toobig._4_4_ =
                 pubkey_pem_to_der(pcVar5,(uchar **)&left,(size_t *)&stack0xffffffffffffff80);
            if (((buf.toobig._4_4_ == CURLE_OK) && (_encode == pFStack_80)) &&
               (iVar1 = memcmp((void *)pubkeylen_local,(void *)left,(size_t)_encode), iVar1 == 0)) {
              encodedlen._4_4_ = CURLE_OK;
            }
          }
        }
      }
LAB_001bb54a:
      Curl_dyn_free((dynbuf *)&pem_ptr);
      (*Curl_cfree)((void *)left);
      left = 0;
      fclose(__stream);
    }
    data_local._4_4_ = encodedlen._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_pin_peer_pubkey(struct Curl_easy *data,
                              const char *pinnedpubkey,
                              const unsigned char *pubkey, size_t pubkeylen)
{
  CURLcode result = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)data;
#endif

  /* if a path was not specified, do not pin */
  if(!pinnedpubkey)
    return CURLE_OK;
  if(!pubkey || !pubkeylen)
    return result;

  /* only do this if pinnedpubkey starts with "sha256//", length 8 */
  if(!strncmp(pinnedpubkey, "sha256//", 8)) {
    CURLcode encode;
    size_t encodedlen = 0;
    char *encoded = NULL, *pinkeycopy, *begin_pos, *end_pos;
    unsigned char *sha256sumdigest;

    if(!Curl_ssl->sha256sum) {
      /* without sha256 support, this cannot match */
      return result;
    }

    /* compute sha256sum of public key */
    sha256sumdigest = malloc(CURL_SHA256_DIGEST_LENGTH);
    if(!sha256sumdigest)
      return CURLE_OUT_OF_MEMORY;
    encode = Curl_ssl->sha256sum(pubkey, pubkeylen,
                                 sha256sumdigest, CURL_SHA256_DIGEST_LENGTH);

    if(!encode)
      encode = Curl_base64_encode((char *)sha256sumdigest,
                                  CURL_SHA256_DIGEST_LENGTH, &encoded,
                                  &encodedlen);
    Curl_safefree(sha256sumdigest);

    if(encode)
      return encode;

    infof(data, " public key hash: sha256//%s", encoded);

    /* it starts with sha256//, copy so we can modify it */
    pinkeycopy = strdup(pinnedpubkey);
    if(!pinkeycopy) {
      Curl_safefree(encoded);
      return CURLE_OUT_OF_MEMORY;
    }
    /* point begin_pos to the copy, and start extracting keys */
    begin_pos = pinkeycopy;
    do {
      end_pos = strstr(begin_pos, ";sha256//");
      /*
       * if there is an end_pos, null terminate,
       * otherwise it will go to the end of the original string
       */
      if(end_pos)
        end_pos[0] = '\0';

      /* compare base64 sha256 digests, 8 is the length of "sha256//" */
      if(encodedlen == strlen(begin_pos + 8) &&
         !memcmp(encoded, begin_pos + 8, encodedlen)) {
        result = CURLE_OK;
        break;
      }

      /*
       * change back the null-terminator we changed earlier,
       * and look for next begin
       */
      if(end_pos) {
        end_pos[0] = ';';
        begin_pos = strstr(end_pos, "sha256//");
      }
    } while(end_pos && begin_pos);
    Curl_safefree(encoded);
    Curl_safefree(pinkeycopy);
  }
  else {
    long filesize;
    size_t size, pem_len;
    CURLcode pem_read;
    struct dynbuf buf;
    char unsigned *pem_ptr = NULL;
    size_t left;
    FILE *fp = fopen(pinnedpubkey, "rb");
    if(!fp)
      return result;

    Curl_dyn_init(&buf, MAX_PINNED_PUBKEY_SIZE);

    /* Determine the file's size */
    if(fseek(fp, 0, SEEK_END))
      goto end;
    filesize = ftell(fp);
    if(fseek(fp, 0, SEEK_SET))
      goto end;
    if(filesize < 0 || filesize > MAX_PINNED_PUBKEY_SIZE)
      goto end;

    /*
     * if the size of our certificate is bigger than the file
     * size then it cannot match
     */
    size = curlx_sotouz((curl_off_t) filesize);
    if(pubkeylen > size)
      goto end;

    /*
     * Read the file into the dynbuf
     */
    left = size;
    do {
      char buffer[1024];
      size_t want = left > sizeof(buffer) ? sizeof(buffer) : left;
      if(want != fread(buffer, 1, want, fp))
        goto end;
      if(Curl_dyn_addn(&buf, buffer, want))
        goto end;
      left -= want;
    } while(left);

    /* If the sizes are the same, it cannot be base64 encoded, must be der */
    if(pubkeylen == size) {
      if(!memcmp(pubkey, Curl_dyn_ptr(&buf), pubkeylen))
        result = CURLE_OK;
      goto end;
    }

    /*
     * Otherwise we will assume it is PEM and try to decode it
     * after placing null terminator
     */
    pem_read = pubkey_pem_to_der(Curl_dyn_ptr(&buf), &pem_ptr, &pem_len);
    /* if it was not read successfully, exit */
    if(pem_read)
      goto end;

    /*
     * if the size of our certificate does not match the size of
     * the decoded file, they cannot be the same, otherwise compare
     */
    if(pubkeylen == pem_len && !memcmp(pubkey, pem_ptr, pubkeylen))
      result = CURLE_OK;
end:
    Curl_dyn_free(&buf);
    Curl_safefree(pem_ptr);
    fclose(fp);
  }

  return result;
}